

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

void ncnn::copy_make_border_image<float>(Mat *src,Mat *dst,int top,int left,int type,float v)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long local_78;
  long lVar20;
  
  auVar26 = _DAT_005fdbf0;
  auVar25 = _DAT_005f1360;
  auVar22 = _DAT_005f1350;
  auVar18 = _DAT_005f1090;
  uVar1 = dst->w;
  lVar8 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar4 = (undefined4 *)src->data;
  pvVar7 = dst->data;
  if (type == 0) {
    if (top < 1) {
      iVar13 = 0;
    }
    else {
      lVar9 = (ulong)uVar1 - 1;
      auVar27._8_4_ = (int)lVar9;
      auVar27._0_8_ = lVar9;
      auVar27._12_4_ = (int)((ulong)lVar9 >> 0x20);
      iVar5 = 0;
      auVar27 = auVar27 ^ _DAT_005f1090;
      do {
        if (0 < (int)uVar1) {
          lVar9 = 0;
          auVar17 = auVar25;
          auVar21 = auVar22;
          do {
            auVar24 = auVar17 ^ auVar18;
            iVar13 = auVar27._4_4_;
            if ((bool)(~(auVar24._4_4_ == iVar13 && auVar27._0_4_ < auVar24._0_4_ ||
                        iVar13 < auVar24._4_4_) & 1)) {
              *(float *)((long)pvVar7 + lVar9) = v;
            }
            if ((auVar24._12_4_ != auVar27._12_4_ || auVar24._8_4_ <= auVar27._8_4_) &&
                auVar24._12_4_ <= auVar27._12_4_) {
              *(float *)((long)pvVar7 + lVar9 + 4) = v;
            }
            auVar24 = auVar21 ^ auVar18;
            iVar14 = auVar24._4_4_;
            if (iVar14 <= iVar13 && (iVar14 != iVar13 || auVar24._0_4_ <= auVar27._0_4_)) {
              *(float *)((long)pvVar7 + lVar9 + 8) = v;
              *(float *)((long)pvVar7 + lVar9 + 0xc) = v;
            }
            lVar6 = auVar26._0_8_;
            lVar20 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + lVar6;
            lVar16 = auVar26._8_8_;
            auVar17._8_8_ = lVar20 + lVar16;
            lVar20 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + lVar6;
            auVar21._8_8_ = lVar20 + lVar16;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar9);
        }
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar5 = iVar5 + 1;
        iVar13 = top;
      } while (iVar5 != top);
    }
    if (iVar13 < src->h + top) {
      local_78 = (long)pvVar7 + 0xc;
      auVar18 = _DAT_005f1350;
      auVar22 = _DAT_005f1360;
      auVar25 = _DAT_005f1090;
      do {
        uVar12 = 0;
        if (0 < left) {
          uVar12 = 0;
          do {
            *(float *)((long)pvVar7 + uVar12 * 4) = v;
            uVar12 = uVar12 + 1;
          } while ((uint)left != uVar12);
        }
        iVar5 = src->w;
        if ((long)iVar5 < 0xc) {
          if ((int)uVar12 < iVar5 + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar12 * 4) = puVar4[uVar12 - (long)left];
              uVar12 = uVar12 + 1;
            } while ((uint)(iVar5 + left) != uVar12);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + (long)left * 4),puVar4,(long)iVar5 << 2);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
          auVar18 = _DAT_005f1350;
          auVar22 = _DAT_005f1360;
          auVar25 = _DAT_005f1090;
        }
        iVar5 = (int)uVar12;
        if (iVar5 < (int)uVar1) {
          lVar6 = lVar8 - iVar5;
          lVar9 = lVar6 + -1;
          auVar26._8_4_ = (int)lVar9;
          auVar26._0_8_ = lVar9;
          auVar26._12_4_ = (int)((ulong)lVar9 >> 0x20);
          lVar9 = local_78 + (long)iVar5 * 4;
          uVar12 = 0;
          do {
            auVar24._8_4_ = (int)uVar12;
            auVar24._0_8_ = uVar12;
            auVar24._12_4_ = (int)(uVar12 >> 0x20);
            auVar27 = (auVar24 | auVar22) ^ auVar25;
            iVar14 = SUB164(auVar26 ^ auVar25,0);
            bVar3 = iVar14 < auVar27._0_4_;
            iVar5 = auVar27._4_4_;
            iVar15 = SUB164(auVar26 ^ auVar25,4);
            if ((bool)(~(iVar15 < iVar5 || iVar5 == iVar15 && bVar3) & 1)) {
              *(float *)(lVar9 + -0xc + uVar12 * 4) = v;
            }
            if (iVar15 >= iVar5 && (iVar5 != iVar15 || !bVar3)) {
              *(float *)(lVar9 + -8 + uVar12 * 4) = v;
            }
            auVar27 = (auVar24 | auVar18) ^ auVar25;
            iVar5 = auVar27._4_4_;
            if (iVar5 <= iVar15 && (iVar5 != iVar15 || auVar27._0_4_ <= iVar14)) {
              *(float *)(lVar9 + -4 + uVar12 * 4) = v;
              *(float *)(lVar9 + uVar12 * 4) = v;
            }
            uVar12 = uVar12 + 4;
          } while ((lVar6 + 3U & 0xfffffffffffffffc) != uVar12);
        }
        puVar4 = puVar4 + src->w;
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar13 = iVar13 + 1;
        local_78 = local_78 + lVar8 * 4;
      } while (iVar13 < src->h + top);
    }
    auVar25 = _DAT_005f1360;
    auVar22 = _DAT_005f1350;
    auVar18 = _DAT_005f1090;
    if (iVar13 < iVar2) {
      lVar9 = (ulong)uVar1 - 1;
      auVar28._8_4_ = (int)lVar9;
      auVar28._0_8_ = lVar9;
      auVar28._12_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar28 = auVar28 ^ _DAT_005f1090;
      do {
        if (0 < (int)uVar1) {
          lVar9 = 0;
          auVar19 = auVar25;
          auVar23 = auVar22;
          do {
            auVar26 = auVar19 ^ auVar18;
            iVar5 = auVar28._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar5 && auVar28._0_4_ < auVar26._0_4_ ||
                        iVar5 < auVar26._4_4_) & 1)) {
              *(float *)((long)pvVar7 + lVar9) = v;
            }
            if ((auVar26._12_4_ != auVar28._12_4_ || auVar26._8_4_ <= auVar28._8_4_) &&
                auVar26._12_4_ <= auVar28._12_4_) {
              *(float *)((long)pvVar7 + lVar9 + 4) = v;
            }
            auVar26 = auVar23 ^ auVar18;
            iVar14 = auVar26._4_4_;
            if (iVar14 <= iVar5 && (iVar14 != iVar5 || auVar26._0_4_ <= auVar28._0_4_)) {
              *(float *)((long)pvVar7 + lVar9 + 8) = v;
              *(float *)((long)pvVar7 + lVar9 + 0xc) = v;
            }
            lVar6 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 4;
            auVar19._8_8_ = lVar6 + 4;
            lVar6 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 4;
            auVar23._8_8_ = lVar6 + 4;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar9);
        }
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar2);
    }
  }
  puVar10 = puVar4;
  if (type == 1) {
    if (top < 1) {
      iVar13 = 0;
    }
    else {
      iVar5 = 0;
      do {
        uVar12 = 0;
        if (0 < left) {
          uVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4) = *puVar4;
            uVar12 = uVar12 + 1;
          } while ((uint)left != uVar12);
        }
        iVar13 = src->w;
        if ((long)iVar13 < 0xc) {
          if ((int)uVar12 < iVar13 + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar12 * 4) = puVar4[uVar12 - (long)left];
              uVar12 = uVar12 + 1;
            } while ((uint)(iVar13 + left) != uVar12);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + (long)left * 4),puVar4,(long)iVar13 << 2);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
        }
        if ((int)uVar12 < (int)uVar1) {
          iVar13 = src->w;
          lVar9 = (long)(int)uVar12;
          do {
            *(undefined4 *)((long)pvVar7 + lVar9 * 4) = puVar4[(long)iVar13 + -1];
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
        }
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar5 = iVar5 + 1;
        iVar13 = top;
      } while (iVar5 != top);
    }
    if (iVar13 < src->h + top) {
      do {
        uVar12 = 0;
        if (0 < left) {
          uVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4) = *puVar4;
            uVar12 = uVar12 + 1;
          } while ((uint)left != uVar12);
        }
        iVar5 = src->w;
        if ((long)iVar5 < 0xc) {
          if ((int)uVar12 < iVar5 + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar12 * 4) = puVar4[uVar12 - (long)left];
              uVar12 = uVar12 + 1;
            } while ((uint)(iVar5 + left) != uVar12);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + (long)left * 4),puVar4,(long)iVar5 << 2);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
        }
        if ((int)uVar12 < (int)uVar1) {
          iVar5 = src->w;
          lVar9 = (long)(int)uVar12;
          do {
            *(undefined4 *)((long)pvVar7 + lVar9 * 4) = puVar4[(long)iVar5 + -1];
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
        }
        puVar4 = puVar4 + src->w;
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar13 = iVar13 + 1;
      } while (iVar13 < src->h + top);
    }
    iVar5 = src->w;
    puVar10 = puVar4 + -(long)iVar5;
    if (iVar13 < iVar2) {
      do {
        uVar12 = 0;
        if (0 < left) {
          uVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar7 + uVar12 * 4) = *puVar10;
            uVar12 = uVar12 + 1;
          } while ((uint)left != uVar12);
        }
        iVar14 = src->w;
        if ((long)iVar14 < 0xc) {
          if ((int)uVar12 < iVar14 + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar12 * 4) =
                   *(undefined4 *)((long)puVar4 + (uVar12 * 4 - ((long)left * 4 + (long)iVar5 * 4)))
              ;
              uVar12 = uVar12 + 1;
            } while ((uint)(iVar14 + left) != uVar12);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + (long)left * 4),puVar10,(long)iVar14 << 2);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
        }
        if ((int)uVar12 < (int)uVar1) {
          iVar14 = src->w;
          lVar9 = (long)(int)uVar12;
          do {
            *(undefined4 *)((long)pvVar7 + lVar9 * 4) = puVar10[(long)iVar14 + -1];
            lVar9 = lVar9 + 1;
          } while (lVar8 != lVar9);
        }
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar2);
    }
  }
  if (type == 2) {
    puVar10 = puVar10 + (long)top * (long)src->w;
    lVar9 = (long)left;
    uVar12 = (ulong)(uint)left;
    if (top < 1) {
      iVar13 = 0;
    }
    else {
      iVar5 = 0;
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar4 = puVar10 + lVar9;
          uVar11 = 0;
          do {
            *(undefined4 *)((long)pvVar7 + uVar11 * 4) = *puVar4;
            uVar11 = uVar11 + 1;
            puVar4 = puVar4 + -1;
          } while (uVar12 != uVar11);
        }
        iVar13 = src->w;
        if ((long)iVar13 < 0xc) {
          if ((int)uVar11 < iVar13 + left) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar11 * 4) = puVar10[uVar11 - lVar9];
              uVar11 = uVar11 + 1;
            } while ((uint)(iVar13 + left) != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + lVar9 * 4),puVar10,(long)iVar13 << 2);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        iVar13 = (int)uVar11;
        if (iVar13 < (int)uVar1) {
          lVar6 = (long)iVar13;
          iVar13 = (left + -2 + src->w * 2) - iVar13;
          do {
            *(undefined4 *)((long)pvVar7 + lVar6 * 4) = puVar10[iVar13];
            lVar6 = lVar6 + 1;
            iVar13 = iVar13 + -1;
          } while (lVar8 != lVar6);
        }
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        puVar10 = puVar10 + -(long)src->w;
        iVar5 = iVar5 + 1;
        iVar13 = top;
      } while (iVar5 != top);
    }
    if (iVar13 < src->h + top) {
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar4 = puVar10 + lVar9;
          uVar11 = 0;
          do {
            *(undefined4 *)((long)pvVar7 + uVar11 * 4) = *puVar4;
            uVar11 = uVar11 + 1;
            puVar4 = puVar4 + -1;
          } while (uVar12 != uVar11);
        }
        iVar5 = src->w;
        if ((long)iVar5 < 0xc) {
          if ((int)uVar11 < iVar5 + left) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar11 * 4) = puVar10[uVar11 - lVar9];
              uVar11 = uVar11 + 1;
            } while ((uint)(iVar5 + left) != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + lVar9 * 4),puVar10,(long)iVar5 << 2);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        iVar5 = (int)uVar11;
        if (iVar5 < (int)uVar1) {
          lVar6 = (long)iVar5;
          iVar5 = (left + -2 + src->w * 2) - iVar5;
          do {
            *(undefined4 *)((long)pvVar7 + lVar6 * 4) = puVar10[iVar5];
            lVar6 = lVar6 + 1;
            iVar5 = iVar5 + -1;
          } while (lVar8 != lVar6);
        }
        puVar10 = puVar10 + src->w;
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        iVar13 = iVar13 + 1;
      } while (iVar13 < src->h + top);
    }
    if (iVar13 < iVar2) {
      puVar10 = puVar10 + (long)src->w * -2;
      do {
        uVar11 = 0;
        if (0 < left) {
          puVar4 = puVar10 + lVar9;
          uVar11 = 0;
          do {
            *(undefined4 *)((long)pvVar7 + uVar11 * 4) = *puVar4;
            uVar11 = uVar11 + 1;
            puVar4 = puVar4 + -1;
          } while (uVar12 != uVar11);
        }
        iVar5 = src->w;
        if ((long)iVar5 < 0xc) {
          if ((int)uVar11 < iVar5 + left) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar7 + uVar11 * 4) = puVar10[uVar11 - lVar9];
              uVar11 = uVar11 + 1;
            } while ((uint)(iVar5 + left) != uVar11);
          }
        }
        else {
          memcpy((void *)((long)pvVar7 + lVar9 * 4),puVar10,(long)iVar5 << 2);
          uVar11 = (ulong)(uint)((int)uVar11 + src->w);
        }
        iVar5 = (int)uVar11;
        if (iVar5 < (int)uVar1) {
          lVar6 = (long)iVar5;
          iVar5 = (left + -2 + src->w * 2) - iVar5;
          do {
            *(undefined4 *)((long)pvVar7 + lVar6 * 4) = puVar10[iVar5];
            lVar6 = lVar6 + 1;
            iVar5 = iVar5 + -1;
          } while (lVar8 != lVar6);
        }
        pvVar7 = (void *)((long)pvVar7 + lVar8 * 4);
        puVar10 = puVar10 + -(long)src->w;
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}